

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

char * get_GLSL_varname(Context *ctx,RegisterType rt,int regnum)

{
  char *pcVar1;
  size_t sVar2;
  size_t in_R8;
  char regnum_str [16];
  char buf [64];
  char acStack_68 [16];
  char local_58 [64];
  
  pcVar1 = get_D3D_register_string(ctx,rt,regnum,acStack_68,in_R8);
  snprintf(local_58,0x40,"%s_%s%s",ctx->shader_type_str,pcVar1,acStack_68);
  sVar2 = strlen(local_58);
  pcVar1 = (char *)(*ctx->malloc)((int)sVar2 + 1,ctx->malloc_data);
  if (pcVar1 == (char *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
  }
  else {
    strcpy(pcVar1,local_58);
  }
  return pcVar1;
}

Assistant:

static const char *get_GLSL_varname(Context *ctx, RegisterType rt, int regnum)
{
    char buf[64];
    get_GLSL_varname_in_buf(ctx, rt, regnum, buf, sizeof (buf));
    return StrDup(ctx, buf);
}